

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateMemCopy(Lowerer *this,Opnd *dst,Opnd *src,uint32 size,Instr *insertBeforeInstr)

{
  Func *func;
  IntConstOpnd *opndArg;
  Instr *this_00;
  HelperCallOpnd *newSrc;
  LowererMD *this_01;
  
  func = this->m_func;
  this_01 = &this->m_lowererMD;
  opndArg = IR::IntConstOpnd::New((ulong)size,TyUint32,func,false);
  LowererMD::LoadHelperArgument(this_01,insertBeforeInstr,&opndArg->super_Opnd);
  LowererMD::LoadHelperArgument(this_01,insertBeforeInstr,src);
  LowererMD::LoadHelperArgument(this_01,insertBeforeInstr,dst);
  this_00 = IR::Instr::New(Call,func);
  newSrc = IR::HelperCallOpnd::New(HelperMemCpy,func);
  IR::Instr::SetSrc1(this_00,&newSrc->super_Opnd);
  IR::Instr::InsertBefore(insertBeforeInstr,this_00);
  LowererMD::LowerCall(this_01,this_00,3);
  return;
}

Assistant:

void
Lowerer::GenerateMemCopy(IR::Opnd * dst, IR::Opnd * src, uint32 size, IR::Instr * insertBeforeInstr)
{
    Func * func = this->m_func;
    this->m_lowererMD.LoadHelperArgument(insertBeforeInstr, IR::IntConstOpnd::New(size, TyUint32, func));
    this->m_lowererMD.LoadHelperArgument(insertBeforeInstr, src);
    this->m_lowererMD.LoadHelperArgument(insertBeforeInstr, dst);
    IR::Instr * memcpyInstr = IR::Instr::New(Js::OpCode::Call, func);
    memcpyInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperMemCpy, func));
    insertBeforeInstr->InsertBefore(memcpyInstr);
    m_lowererMD.LowerCall(memcpyInstr, 3);
}